

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

int mbedtls_ssl_write(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  ulong uVar2;
  int line;
  char *text;
  size_t __n;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1730,"=> write");
  if (ssl == (mbedtls_ssl_context *)0x0) {
    return -0x7100;
  }
  if (ssl->conf == (mbedtls_ssl_config *)0x0) {
    return -0x7100;
  }
  if ((ssl->state != 0x1b) && (iVar1 = mbedtls_ssl_handshake(ssl), iVar1 != 0)) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x173f,"mbedtls_ssl_handshake",iVar1);
    return iVar1;
  }
  iVar1 = mbedtls_ssl_get_max_out_record_payload(ssl);
  if (iVar1 < 0) {
    text = "mbedtls_ssl_get_max_out_record_payload";
    line = 0x16f8;
    goto LAB_0020a6d2;
  }
  uVar2 = (ulong)iVar1;
  __n = len;
  if ((uVar2 < len) && (__n = uVar2, ssl->conf->transport == '\x01')) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x1702,"fragment larger than the (negotiated) maximum fragment length: %zu > %zu",
               len,uVar2);
    iVar1 = -0x7100;
    goto LAB_0020a6df;
  }
  if (ssl->out_left == 0) {
    ssl->out_msglen = __n;
    ssl->out_msgtype = 0x17;
    if (__n != 0) {
      memcpy(ssl->out_msg,buf,__n);
    }
    iVar1 = mbedtls_ssl_write_record(ssl,1);
    if (iVar1 == 0) goto LAB_0020a6dc;
    text = "mbedtls_ssl_write_record";
    line = 0x1721;
  }
  else {
    iVar1 = mbedtls_ssl_flush_output(ssl);
    if (iVar1 == 0) {
LAB_0020a6dc:
      iVar1 = (int)__n;
      goto LAB_0020a6df;
    }
    text = "mbedtls_ssl_flush_output";
    line = 0x1711;
  }
LAB_0020a6d2:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,line,text,iVar1);
LAB_0020a6df:
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
             ,0x1746,"<= write");
  return iVar1;
}

Assistant:

int mbedtls_ssl_write(mbedtls_ssl_context *ssl, const unsigned char *buf, size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write"));

    if (ssl == NULL || ssl->conf == NULL) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if ((ret = ssl_check_ctr_renegotiate(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_check_ctr_renegotiate", ret);
        return ret;
    }
#endif

    if (ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER) {
        if ((ret = mbedtls_ssl_handshake(ssl)) != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_handshake", ret);
            return ret;
        }
    }

    ret = ssl_write_real(ssl, buf, len);

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write"));

    return ret;
}